

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_helper.hpp
# Opt level: O0

void __thiscall TempFile::TempFile(TempFile *this,string *name)

{
  byte bVar1;
  runtime_error *this_00;
  string local_38;
  string *local_18;
  string *name_local;
  TempFile *this_local;
  
  local_18 = name;
  name_local = &this->_name;
  std::__cxx11::string::string((string *)this,(string *)name);
  CLI::NonexistentPath(&local_38,&this->_name);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_38);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)this);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TempFile(std::string name) : _name(name) {
        if(!CLI::NonexistentPath(_name).empty())
            throw std::runtime_error(_name);
    }